

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__read_uint16(ma_dr_flac_bs *bs,uint bitCount,ma_uint16 *pResult)

{
  ulong uVar1;
  ma_bool32 mVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ma_uint16 mVar6;
  ulong uVar7;
  
  uVar3 = bs->consumedBits;
  if (uVar3 == 0x40) {
    mVar2 = ma_dr_flac__reload_cache(bs);
    if (mVar2 == 0) {
      return 0;
    }
    uVar3 = bs->consumedBits;
  }
  uVar7 = 0x40 - (ulong)uVar3;
  if (uVar7 < bitCount) {
    uVar1 = bs->cache;
    mVar2 = ma_dr_flac__reload_cache(bs);
    if (mVar2 == 0) {
      return 0;
    }
    uVar5 = bitCount - (int)uVar7;
    if (0x40 - (ulong)bs->consumedBits < (ulong)uVar5) {
      return 0;
    }
    bVar4 = (byte)uVar5;
    mVar6 = (ushort)((~(0xffffffffffffffffU >> (bVar4 & 0x3f)) & bs->cache) >> (-bVar4 & 0x3f)) |
            (ushort)((int)((~(0xffffffffffffffffU >> ((byte)uVar7 & 0x3f)) & uVar1) >>
                          ((byte)uVar3 & 0x3f)) << (bVar4 & 0x1f));
    bs->consumedBits = bs->consumedBits + uVar5;
    bs->cache = bs->cache << (bVar4 & 0x3f);
  }
  else {
    bVar4 = (byte)bitCount;
    mVar6 = (ma_uint16)((~(0xffffffffffffffffU >> (bVar4 & 0x3f)) & bs->cache) >> (-bVar4 & 0x3f));
    bs->consumedBits = uVar3 + bitCount;
    bs->cache = bs->cache << (bVar4 & 0x3f);
  }
  *pResult = mVar6;
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__read_uint16(ma_dr_flac_bs* bs, unsigned int bitCount, ma_uint16* pResult)
{
    ma_uint32 result;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pResult != NULL);
    MA_DR_FLAC_ASSERT(bitCount > 0);
    MA_DR_FLAC_ASSERT(bitCount <= 16);
    if (!ma_dr_flac__read_uint32(bs, bitCount, &result)) {
        return MA_FALSE;
    }
    *pResult = (ma_uint16)result;
    return MA_TRUE;
}